

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-time.c
# Opt level: O0

int run_test_loop_backend_timeout(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  undefined8 uVar2;
  undefined1 local_a8 [4];
  int r;
  uv_timer_t timer;
  uv_loop_t *loop;
  
  timer.start_id = uv_default_loop();
  iVar1 = uv_timer_init(timer.start_id,local_a8);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-time.c"
            ,0x2f,"r == 0");
    abort();
  }
  iVar1 = uv_loop_alive(timer.start_id);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-time.c"
            ,0x31,"!uv_loop_alive(loop)");
    abort();
  }
  iVar1 = uv_backend_timeout(timer.start_id);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-time.c"
            ,0x32,"uv_backend_timeout(loop) == 0");
    abort();
  }
  iVar1 = uv_timer_start(local_a8,cb,1000,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-time.c"
            ,0x35,"r == 0");
    abort();
  }
  iVar1 = uv_backend_timeout(timer.start_id);
  if (iVar1 < 0x65) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-time.c"
            ,0x36,"uv_backend_timeout(loop) > 100");
    abort();
  }
  iVar1 = uv_backend_timeout(timer.start_id);
  if (1000 < iVar1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-time.c"
            ,0x37,"uv_backend_timeout(loop) <= 1000");
    abort();
  }
  iVar1 = uv_run(timer.start_id,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-time.c"
            ,0x3a,"r == 0");
    abort();
  }
  iVar1 = uv_backend_timeout(timer.start_id);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-time.c"
            ,0x3b,"uv_backend_timeout(loop) == 0");
    abort();
  }
  loop_00 = (uv_loop_t *)uv_default_loop();
  close_loop(loop_00);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-time.c"
            ,0x3d,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(loop_backend_timeout) {
  uv_loop_t *loop = uv_default_loop();
  uv_timer_t timer;
  int r;

  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);

  ASSERT(!uv_loop_alive(loop));
  ASSERT(uv_backend_timeout(loop) == 0);

  r = uv_timer_start(&timer, cb, 1000, 0); /* 1 sec */
  ASSERT(r == 0);
  ASSERT(uv_backend_timeout(loop) > 100); /* 0.1 sec */
  ASSERT(uv_backend_timeout(loop) <= 1000); /* 1 sec */

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(uv_backend_timeout(loop) == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}